

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

LocVar * getlocvar(FuncState *fs,int i)

{
  short sVar1;
  
  sVar1 = (fs->ls->dyd->actvar).arr[(long)i + (long)fs->firstlocal].idx;
  if (sVar1 < fs->nlocvars) {
    return fs->f->locvars + sVar1;
  }
  __assert_fail("idx < fs->nlocvars",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                ,0x1ca,"LocVar *getlocvar(FuncState *, int)");
}

Assistant:

static LocVar *getlocvar (FuncState *fs, int i) {
  /* convert from local stack position i to global 
   * and then retrieve the index
   * of the variable in f->locvars
   */
  int idx = fs->ls->dyd->actvar.arr[fs->firstlocal + i].idx;
  lua_assert(idx < fs->nlocvars);
  return &fs->f->locvars[idx];
}